

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::forward
          (DeconvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int iVar14;
  int *piVar15;
  void *pvVar16;
  size_t sVar17;
  undefined4 *puVar18;
  Layer *pLVar19;
  bool bVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined4 uVar24;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  Mat *pMVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  uint uVar43;
  uint uVar44;
  float *pfVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  undefined1 (*pauVar49) [32];
  undefined1 (*pauVar50) [16];
  ulong uVar51;
  ulong uVar52;
  void *pvVar53;
  int iVar54;
  int iVar55;
  ulong uVar56;
  size_t sVar57;
  int x;
  long lVar58;
  ulong uVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar73;
  float fVar74;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar86 [28];
  float fVar75;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar76 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar121 [16];
  float fVar119;
  float fVar120;
  float fVar136;
  float fVar138;
  float fVar140;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar139;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar135;
  float fVar137;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 in_ZMM7 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  float fVar154;
  undefined1 auVar153 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar162;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar159 [64];
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [32];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  long local_320;
  ulong local_2f8;
  uint local_2d8;
  int local_2c8;
  Mat local_298;
  uint local_248;
  uint local_238;
  undefined1 auStack_234 [12];
  ulong local_228;
  void *local_220;
  long local_218;
  void *local_210;
  undefined1 local_208 [40];
  undefined1 auStack_1e0 [16];
  ulong uStack_1d0;
  size_t local_1c8;
  Mat *local_1c0;
  undefined1 local_1b8 [40];
  undefined1 local_190 [16];
  int local_180;
  size_t local_178;
  ulong local_170;
  ulong local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  void *local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  Allocator *local_138;
  int local_130;
  Allocator *local_128;
  undefined1 local_120 [16];
  int local_110;
  ulong local_108;
  void *local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  ulong local_e8;
  int local_e0;
  Allocator *local_d8;
  undefined1 local_d0 [16];
  int local_c0;
  ulong local_b8;
  undefined1 local_a8 [16];
  long local_90;
  void *local_88;
  void *local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar26;
  undefined3 uVar28;
  undefined2 uVar30;
  undefined1 auVar104 [32];
  undefined1 auVar107 [32];
  undefined1 auVar134 [32];
  undefined1 auVar160 [64];
  
  uVar51 = bottom_blob->elemsize;
  local_228 = (ulong)bottom_blob->elempack;
  uVar33 = 1;
  if (opt->use_packing_layout == true) {
    uVar34 = (this->super_DeconvolutionDepthWise).num_output;
    uVar33 = 8;
    if ((uVar34 & 7) != 0) {
      uVar33 = (uint)((uVar34 & 3) == 0) * 3 + 1;
    }
  }
  local_168._0_4_ = bottom_blob->w;
  local_168._4_4_ = bottom_blob->h;
  uVar4 = (this->super_DeconvolutionDepthWise).kernel_w;
  uVar8 = (this->super_DeconvolutionDepthWise).kernel_h;
  auVar116._4_4_ = uVar8;
  auVar116._0_4_ = uVar4;
  uVar5 = (this->super_DeconvolutionDepthWise).dilation_w;
  uVar9 = (this->super_DeconvolutionDepthWise).dilation_h;
  auVar156._4_4_ = uVar9;
  auVar156._0_4_ = uVar5;
  uVar6 = (this->super_DeconvolutionDepthWise).stride_w;
  uVar10 = (this->super_DeconvolutionDepthWise).stride_h;
  auVar111._4_4_ = uVar10;
  auVar111._0_4_ = uVar6;
  uVar34 = bottom_blob->c;
  uVar59 = (ulong)uVar34;
  uVar7 = (this->super_DeconvolutionDepthWise).output_pad_right;
  uVar11 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  auVar114._4_4_ = uVar11;
  auVar114._0_4_ = uVar7;
  local_298.cstep = 0;
  local_298.data = (void *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize._0_4_ = 0;
  local_298.elemsize._4_4_ = 0;
  local_298.elempack = 0;
  local_298.allocator = (Allocator *)0x0;
  local_298.dims = 0;
  local_298.w = 0;
  local_298.h = 0;
  local_298.d = 0;
  local_298.c = 0;
  auVar93._0_4_ = (this->super_DeconvolutionDepthWise).pad_left;
  auVar93._4_4_ = (this->super_DeconvolutionDepthWise).pad_right;
  auVar93._8_4_ = (this->super_DeconvolutionDepthWise).pad_top;
  auVar93._12_4_ = (this->super_DeconvolutionDepthWise).pad_bottom;
  auVar121 = vpcmpgtd_avx(auVar93,(undefined1  [16])0x0);
  lVar58 = 0x10;
  if (((((auVar121 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar121 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar121 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar121[0xf])
     && ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
          ((this->super_DeconvolutionDepthWise).output_h < 1)) &&
         (lVar58 = 8, &local_298 != top_blob)))) {
    piVar15 = top_blob->refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    local_298.data = top_blob->data;
    local_298.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_298.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_298.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_298.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_298.elempack = top_blob->elempack;
    local_298.allocator = top_blob->allocator;
    auVar121._0_4_ = top_blob->dims;
    auVar121._4_4_ = top_blob->w;
    uVar12 = top_blob->h;
    uVar13 = top_blob->d;
    auVar121._8_8_ = CONCAT44(uVar13,uVar12);
    local_298.c = top_blob->c;
    local_298.cstep = top_blob->cstep;
    local_298.dims = auVar121._0_4_;
    local_298.w = auVar121._4_4_;
    local_298._48_8_ = auVar121._8_8_;
  }
  auVar116._8_8_ = 0;
  auVar156._8_8_ = 0;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_168;
  uStack_160 = 0;
  auVar114._8_8_ = 0;
  auVar111._8_8_ = 0;
  auVar121 = vpcmpeqd_avx(auVar121,auVar121);
  auVar93 = vpaddd_avx(auVar116,auVar121);
  local_a8 = vpmulld_avx(auVar93,auVar156);
  auVar109 = ZEXT1664(local_a8);
  auVar93 = vpaddd_avx(auVar76,auVar121);
  auVar93 = vpmulld_avx(auVar111,auVar93);
  auVar93 = vpaddd_avx(local_a8,auVar93);
  auVar93 = vpaddd_avx(auVar93,auVar114);
  local_158 = vpsubd_avx(auVar93,auVar121);
  sVar57 = (uVar51 / local_228) * (ulong)uVar33;
  iVar39 = local_158._0_4_;
  iVar46 = local_158._4_4_;
  local_1c0 = top_blob;
  Mat::create(&local_298,iVar39,iVar46,(this->super_DeconvolutionDepthWise).num_output / (int)uVar33
              ,sVar57,uVar33,*(Allocator **)(&opt->lightmode + lVar58));
  iVar47 = -100;
  if ((local_298.data == (void *)0x0) || ((long)local_298.c * local_298.cstep == 0))
  goto LAB_00470818;
  iVar47 = (this->super_DeconvolutionDepthWise).num_output;
  iVar55 = (int)local_228;
  iVar54 = (this->super_DeconvolutionDepthWise).group;
  if (iVar54 == iVar47 && uVar34 * iVar55 == iVar54) {
    uVar33 = (this->super_DeconvolutionDepthWise).kernel_h *
             (this->super_DeconvolutionDepthWise).kernel_w;
    local_170 = (ulong)uVar33;
    uVar2 = local_a8._4_4_;
    iVar54 = (int)local_168;
    iVar47 = (int)(local_168 >> 0x20);
    if (iVar55 == 1) {
      if (0 < (int)uVar34) {
        local_218 = local_298.cstep *
                    CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
        local_80 = local_298.data;
        local_220 = (this->weight_data_tm).data;
        iVar55 = bottom_blob->w;
        local_88 = bottom_blob->data;
        sVar57 = bottom_blob->elemsize;
        local_90 = bottom_blob->cstep * sVar57;
        auVar93 = vpcmpgtd_avx(local_158,(undefined1  [16])0x0);
        auVar93 = vpmovsxdq_avx(auVar93);
        uVar43 = vmovmskpd_avx(auVar93);
        uVar51 = 1;
        if (1 < (int)uVar34) {
          uVar51 = uVar59;
        }
        local_158._0_8_ = uVar51;
        local_238 = iVar47;
        local_168 = (long)(int)uVar33 << 2;
        local_228 = CONCAT44(local_228._4_4_,-local_a8._0_4_);
        local_320 = 0;
        do {
          pvVar16 = local_88;
          if ((byte)((byte)uVar43 >> 1) != 0) {
            lVar58 = local_90 * local_320;
            pfVar45 = (float *)(local_218 * local_320 + (long)local_80);
            uVar33 = (this->super_DeconvolutionDepthWise).kernel_h;
            iVar47 = (this->super_DeconvolutionDepthWise).bias_term;
            iVar38 = (this->super_DeconvolutionDepthWise).activation_type;
            iVar48 = 0;
            do {
              if ((uVar43 & 1) != 0) {
                local_210 = (this->super_DeconvolutionDepthWise).bias_data.data;
                iVar35 = (this->super_DeconvolutionDepthWise).dilation_h;
                pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                iVar40 = 0;
                local_248 = (uint)local_228;
                do {
                  if (iVar47 == 0) {
                    auVar109 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar109 = ZEXT464(*(uint *)((long)local_210 + local_320 * 4));
                  }
                  auVar93 = auVar109._0_16_;
                  if (0 < (int)uVar33) {
                    iVar14 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar34 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar36 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar51 = 0;
                    pvVar53 = local_220;
                    do {
                      iVar42 = iVar35 * (int)uVar51 + (iVar48 - uVar2);
                      if (-1 < iVar42) {
                        iVar37 = iVar42 / iVar14;
                        if ((iVar37 < (int)local_238 && iVar42 % iVar14 == 0) && (0 < (int)uVar34))
                        {
                          uVar59 = 0;
                          uVar44 = local_248;
                          do {
                            if ((-1 < (int)uVar44) &&
                               (iVar42 = (int)uVar44 / iVar36,
                               iVar42 < iVar54 && (int)uVar44 % iVar36 == 0)) {
                              auVar109 = ZEXT464((uint)(*(float *)((long)pvVar53 + uVar59 * 4) *
                                                        *(float *)((long)pvVar16 +
                                                                  (long)iVar42 * 4 +
                                                                  (long)iVar37 *
                                                                  (long)iVar55 * sVar57 + lVar58) +
                                                       auVar109._0_4_));
                            }
                            uVar59 = uVar59 + 1;
                            uVar44 = uVar44 + (this->super_DeconvolutionDepthWise).dilation_w;
                          } while (uVar34 != uVar59);
                        }
                      }
                      auVar93 = auVar109._0_16_;
                      uVar51 = uVar51 + 1;
                      pvVar53 = (void *)((long)pvVar53 + (ulong)uVar34 * 4);
                    } while (uVar51 != uVar33);
                  }
                  fVar110 = auVar93._0_4_;
                  fVar60 = fVar110;
                  switch(iVar38) {
                  case 1:
                    auVar93 = vmaxss_avx(auVar93,ZEXT416(0));
                    fVar60 = auVar93._0_4_;
                    break;
                  case 2:
                    auVar93 = vcmpss_avx(ZEXT816(0) << 0x40,auVar93,1);
                    auVar85._8_4_ = 0x3f800000;
                    auVar85._0_8_ = 0x3f8000003f800000;
                    auVar85._12_4_ = 0x3f800000;
                    auVar93 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar85,auVar93);
                    fVar60 = auVar93._0_4_ * fVar110;
                    break;
                  case 3:
                    auVar93 = vmaxss_avx(auVar93,ZEXT416((uint)*pfVar1));
                    fVar60 = auVar93._0_4_;
                    if (pfVar1[1] < auVar93._0_4_) {
                      fVar60 = pfVar1[1];
                    }
                    break;
                  case 4:
                    auVar93 = vminss_avx(auVar93,ZEXT416(0x42b0c0a5));
                    auVar72._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
                    auVar72._8_4_ = auVar93._8_4_ ^ 0x80000000;
                    auVar72._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    auVar93 = vcmpss_avx(auVar93,ZEXT416(0xc2b0c0a5),1);
                    auVar84._8_4_ = 0x42b0c0a5;
                    auVar84._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar84._12_4_ = 0x42b0c0a5;
                    auVar93 = vblendvps_avx(auVar72,auVar84,auVar93);
                    fVar60 = expf(auVar93._0_4_);
                    fVar60 = 1.0 / (fVar60 + 1.0);
                    break;
                  case 5:
                    fVar60 = expf(fVar110);
                    fVar60 = logf(fVar60 + 1.0);
                    fVar60 = tanhf(fVar60);
                    fVar60 = fVar60 * fVar110;
                    break;
                  case 6:
                    fVar3 = *pfVar1;
                    fVar91 = -pfVar1[1] / fVar3;
                    fVar60 = 0.0;
                    if ((fVar91 <= fVar110) && (fVar60 = fVar110, fVar110 <= fVar91 + 1.0 / fVar3))
                    {
                      fVar60 = (fVar3 * fVar110 + pfVar1[1]) * fVar110;
                    }
                  }
                  *pfVar45 = fVar60;
                  pfVar45 = pfVar45 + 1;
                  iVar40 = iVar40 + 1;
                  local_248 = local_248 + 1;
                } while (iVar40 != iVar39);
              }
              iVar48 = iVar48 + 1;
            } while (iVar48 != iVar46);
          }
          local_320 = local_320 + 1;
          local_220 = (void *)((long)local_220 + local_168);
        } while (local_320 != local_158._0_8_);
      }
    }
    else if (iVar55 == 4) {
      if (0 < (int)uVar34) {
        local_218 = CONCAT44(local_218._4_4_,uVar33 * 4);
        auVar93 = vpcmpgtd_avx(local_158,(undefined1  [16])0x0);
        auVar93 = vpmovsxdq_avx(auVar93);
        uVar34 = vmovmskpd_avx(auVar93);
        local_220 = (void *)CONCAT44(local_220._4_4_,uVar34);
        local_2f8 = 0;
        auVar117._8_4_ = 0x3f000000;
        auVar117._0_8_ = 0x3f0000003f000000;
        auVar117._12_4_ = 0x3f000000;
        auVar109 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if ((byte)((byte)uVar34 >> 1) != 0) {
            pvVar16 = (this->weight_data_tm).data;
            sVar57 = bottom_blob->cstep;
            sVar17 = bottom_blob->elemsize;
            pvVar53 = bottom_blob->data;
            iVar55 = bottom_blob->w;
            pauVar50 = (undefined1 (*) [16])
                       (local_298.cstep * local_2f8 *
                        CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize) +
                       (long)local_298.data);
            local_210 = (void *)(local_2f8 * 0x10);
            iVar38 = 0;
            do {
              if ((uVar34 & 1) != 0) {
                local_238 = iVar38 - local_a8._4_4_;
                iVar35 = 0;
                iVar48 = -local_a8._0_4_;
                do {
                  if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                    auVar113 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar113 = ZEXT1664(*(undefined1 (*) [16])
                                         ((long)(this->super_DeconvolutionDepthWise).bias_data.data
                                         + (long)local_210));
                  }
                  auVar71 = auVar113._0_16_;
                  iVar40 = (this->super_DeconvolutionDepthWise).kernel_h;
                  if (0 < iVar40) {
                    local_248 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar43 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar14 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar51 = 0;
                    lVar58 = 0;
                    do {
                      iVar36 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar58 +
                               (iVar38 - local_a8._4_4_);
                      if ((((-1 < iVar36) && (iVar36 % (int)local_248 == 0)) &&
                          (iVar36 / (int)local_248 < iVar47)) && (0 < (int)uVar43)) {
                        uVar52 = (ulong)uVar43;
                        uVar56 = uVar51;
                        iVar42 = iVar48;
                        do {
                          if ((-1 < iVar42) &&
                             (iVar37 = iVar42 / iVar14, iVar37 < iVar54 && iVar42 % iVar14 == 0)) {
                            pfVar1 = (float *)((long)pvVar16 +
                                              (uVar56 & 0xffffffff) * 4 +
                                              (long)(int)(uVar33 * 4 * (int)local_2f8) * 4);
                            pfVar45 = (float *)((long)pvVar53 +
                                               (long)(iVar37 << 2) * 4 +
                                               (long)(iVar36 / (int)local_248) *
                                               (long)iVar55 * sVar17 + sVar57 * local_2f8 * sVar17);
                            auVar113 = ZEXT1664(CONCAT412(pfVar1[3] * pfVar45[3] + auVar113._12_4_,
                                                          CONCAT48(pfVar1[2] * pfVar45[2] +
                                                                   auVar113._8_4_,
                                                                   CONCAT44(pfVar1[1] * pfVar45[1] +
                                                                            auVar113._4_4_,
                                                                            *pfVar1 * *pfVar45 +
                                                                            auVar113._0_4_))));
                          }
                          iVar42 = iVar42 + (this->super_DeconvolutionDepthWise).dilation_w;
                          uVar56 = uVar56 + 4;
                          uVar52 = uVar52 - 1;
                        } while (uVar52 != 0);
                      }
                      auVar71 = auVar113._0_16_;
                      lVar58 = lVar58 + 1;
                      uVar51 = uVar51 + (ulong)uVar43 * 4;
                    } while (lVar58 != iVar40);
                  }
                  auVar93 = auVar109._0_16_;
                  fVar60 = auVar109._0_4_;
                  fVar110 = auVar109._4_4_;
                  fVar3 = auVar109._8_4_;
                  fVar91 = auVar109._12_4_;
                  fVar67 = auVar71._4_4_;
                  fVar73 = auVar71._8_4_;
                  fVar74 = auVar71._12_4_;
                  switch((this->super_DeconvolutionDepthWise).activation_type) {
                  case 1:
                    auVar71 = vmaxps_avx(auVar71,_DAT_005ef030);
                    break;
                  case 2:
                    auVar93 = vmaxps_avx(auVar71,(undefined1  [16])0x0);
                    auVar121 = vminps_avx(auVar71,(undefined1  [16])0x0);
                    fVar60 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                    auVar71._0_4_ = fVar60 * auVar121._0_4_ + auVar93._0_4_;
                    auVar71._4_4_ = fVar60 * auVar121._4_4_ + auVar93._4_4_;
                    auVar71._8_4_ = fVar60 * auVar121._8_4_ + auVar93._8_4_;
                    auVar71._12_4_ = fVar60 * auVar121._12_4_ + auVar93._12_4_;
                    break;
                  case 3:
                    puVar18 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar2 = *puVar18;
                    auVar127._4_4_ = uVar2;
                    auVar127._0_4_ = uVar2;
                    auVar127._8_4_ = uVar2;
                    auVar127._12_4_ = uVar2;
                    uVar2 = puVar18[1];
                    auVar169._4_4_ = uVar2;
                    auVar169._0_4_ = uVar2;
                    auVar169._8_4_ = uVar2;
                    auVar169._12_4_ = uVar2;
                    auVar93 = vmaxps_avx(auVar71,auVar127);
                    auVar71 = vminps_avx(auVar169,auVar93);
                    break;
                  case 4:
                    auVar69._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
                    auVar69._8_4_ = -fVar73;
                    auVar69._12_4_ = -fVar74;
                    auVar81._8_4_ = 0x42b0c0a5;
                    auVar81._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar81._12_4_ = 0x42b0c0a5;
                    auVar121 = vminps_avx(auVar69,auVar81);
                    auVar82._8_4_ = 0xc2b0c0a5;
                    auVar82._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar82._12_4_ = 0xc2b0c0a5;
                    auVar111 = vmaxps_avx(auVar121,auVar82);
                    auVar128._0_4_ = auVar111._0_4_ * 1.442695 + 0.5;
                    auVar128._4_4_ = auVar111._4_4_ * 1.442695 + 0.5;
                    auVar128._8_4_ = auVar111._8_4_ * 1.442695 + 0.5;
                    auVar128._12_4_ = auVar111._12_4_ * 1.442695 + 0.5;
                    auVar170._0_4_ = (int)auVar128._0_4_;
                    auVar170._4_4_ = (int)auVar128._4_4_;
                    auVar170._8_4_ = (int)auVar128._8_4_;
                    auVar170._12_4_ = (int)auVar128._12_4_;
                    auVar156 = vcvtdq2ps_avx(auVar170);
                    auVar121 = vcmpps_avx(auVar128,auVar156,1);
                    auVar121 = vandps_avx(auVar121,auVar93);
                    auVar121 = vsubps_avx(auVar156,auVar121);
                    fVar67 = auVar121._0_4_ * -0.6931472 + auVar111._0_4_;
                    fVar73 = auVar121._4_4_ * -0.6931472 + auVar111._4_4_;
                    fVar74 = auVar121._8_4_ * -0.6931472 + auVar111._8_4_;
                    fVar75 = auVar121._12_4_ * -0.6931472 + auVar111._12_4_;
                    auVar129._0_4_ = (int)auVar121._0_4_;
                    auVar129._4_4_ = (int)auVar121._4_4_;
                    auVar129._8_4_ = (int)auVar121._8_4_;
                    auVar129._12_4_ = (int)auVar121._12_4_;
                    auVar121 = vpslld_avx(auVar129,0x17);
                    auVar121 = vpaddd_avx(auVar121,auVar93);
                    auVar70._0_4_ =
                         (fVar67 * fVar67 *
                          (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) *
                             fVar67 + 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) +
                         fVar67 + fVar60) * auVar121._0_4_ + fVar60;
                    auVar70._4_4_ =
                         (fVar73 * fVar73 *
                          (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) *
                             fVar73 + 0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) +
                         fVar73 + fVar110) * auVar121._4_4_ + fVar110;
                    auVar70._8_4_ =
                         (fVar74 * fVar74 *
                          (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) *
                             fVar74 + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) +
                         fVar74 + fVar3) * auVar121._8_4_ + fVar3;
                    auVar70._12_4_ =
                         (fVar75 * fVar75 *
                          (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) *
                             fVar75 + 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) +
                         fVar75 + fVar91) * auVar121._12_4_ + fVar91;
                    auVar71 = vdivps_avx(auVar93,auVar70);
                    break;
                  case 5:
                    auVar112._8_4_ = 0x42b0c0a5;
                    auVar112._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar112._12_4_ = 0x42b0c0a5;
                    auVar121 = vminps_avx(auVar71,auVar112);
                    auVar148._8_4_ = 0xc2b0c0a5;
                    auVar148._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar148._12_4_ = 0xc2b0c0a5;
                    auVar111 = vmaxps_avx(auVar148,auVar121);
                    auVar155._0_4_ = auVar111._0_4_ * 1.442695 + 0.5;
                    auVar155._4_4_ = auVar111._4_4_ * 1.442695 + 0.5;
                    auVar155._8_4_ = auVar111._8_4_ * 1.442695 + 0.5;
                    auVar155._12_4_ = auVar111._12_4_ * 1.442695 + 0.5;
                    auVar167._0_4_ = (int)auVar155._0_4_;
                    auVar167._4_4_ = (int)auVar155._4_4_;
                    auVar167._8_4_ = (int)auVar155._8_4_;
                    auVar167._12_4_ = (int)auVar155._12_4_;
                    auVar156 = vcvtdq2ps_avx(auVar167);
                    auVar121 = vcmpps_avx(auVar155,auVar156,1);
                    auVar121 = vandps_avx(auVar121,auVar93);
                    auVar121 = vsubps_avx(auVar156,auVar121);
                    auVar168._0_4_ = auVar121._0_4_ * 0.6931472;
                    auVar168._4_4_ = auVar121._4_4_ * 0.6931472;
                    auVar168._8_4_ = auVar121._8_4_ * 0.6931472;
                    auVar168._12_4_ = auVar121._12_4_ * 0.6931472;
                    auVar156 = vsubps_avx(auVar111,auVar168);
                    fVar75 = auVar156._0_4_;
                    fVar120 = auVar156._4_4_;
                    fVar136 = auVar156._8_4_;
                    fVar138 = auVar156._12_4_;
                    auVar123._0_4_ = (int)auVar121._0_4_;
                    auVar123._4_4_ = (int)auVar121._4_4_;
                    auVar123._8_4_ = (int)auVar121._8_4_;
                    auVar123._12_4_ = (int)auVar121._12_4_;
                    auVar121 = vpslld_avx(auVar123,0x17);
                    auVar121 = vpaddd_avx(auVar121,auVar93);
                    auVar124._0_4_ =
                         (fVar75 + fVar60 +
                         fVar75 * fVar75 *
                         (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) *
                            fVar75 + 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5)) *
                         auVar121._0_4_ + fVar60;
                    auVar124._4_4_ =
                         (fVar120 + fVar110 +
                         fVar120 * fVar120 *
                         (((((fVar120 * 0.00019875691 + 0.0013981999) * fVar120 + 0.008333452) *
                            fVar120 + 0.041665796) * fVar120 + 0.16666666) * fVar120 + 0.5)) *
                         auVar121._4_4_ + fVar110;
                    auVar124._8_4_ =
                         (fVar136 + fVar3 +
                         fVar136 * fVar136 *
                         (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) *
                            fVar136 + 0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) *
                         auVar121._8_4_ + fVar3;
                    auVar124._12_4_ =
                         (fVar138 + fVar91 +
                         fVar138 * fVar138 *
                         (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                            fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) *
                         auVar121._12_4_ + fVar91;
                    auVar77._8_4_ = 0x800000;
                    auVar77._0_8_ = 0x80000000800000;
                    auVar77._12_4_ = 0x800000;
                    auVar121 = vmaxps_avx(auVar124,auVar77);
                    auVar156 = vpsrld_avx(auVar121,0x17);
                    auVar95._8_4_ = 0xffffff82;
                    auVar95._0_8_ = 0xffffff82ffffff82;
                    auVar95._12_4_ = 0xffffff82;
                    auVar156 = vpaddd_avx(auVar156,auVar95);
                    auVar96._8_4_ = 0x807fffff;
                    auVar96._0_8_ = 0x807fffff807fffff;
                    auVar96._12_4_ = 0x807fffff;
                    auVar121 = vandps_avx(auVar121,auVar96);
                    auVar114 = vorps_avx(auVar121,auVar117);
                    auVar111 = vcvtdq2ps_avx(auVar156);
                    auVar97._8_4_ = 0x3f3504f3;
                    auVar97._0_8_ = 0x3f3504f33f3504f3;
                    auVar97._12_4_ = 0x3f3504f3;
                    auVar156 = vcmpps_avx(auVar114,auVar97,1);
                    auVar121 = vandps_avx(auVar156,auVar114);
                    fVar75 = auVar114._0_4_ + -1.0 + auVar121._0_4_;
                    fVar120 = auVar114._4_4_ + -1.0 + auVar121._4_4_;
                    fVar136 = auVar114._8_4_ + -1.0 + auVar121._8_4_;
                    fVar138 = auVar114._12_4_ + -1.0 + auVar121._12_4_;
                    auVar121 = vandps_avx(auVar156,auVar93);
                    auVar156 = vsubps_avx(auVar111,auVar121);
                    auVar121 = vcmpps_avx(auVar124,_DAT_005ef030,2);
                    auVar78._0_4_ =
                         (fVar75 * fVar75 *
                          (((((((((fVar75 * 0.070376836 + -0.1151461) * fVar75 + 0.116769984) *
                                 fVar75 + -0.12420141) * fVar75 + 0.14249323) * fVar75 + -0.16668057
                              ) * fVar75 + 0.20000714) * fVar75 + -0.24999994) * fVar75 + 0.3333333)
                           * fVar75 + -0.5) + auVar156._0_4_ * 0.6931472 + fVar75) * -2.0;
                    auVar78._4_4_ =
                         (fVar120 * fVar120 *
                          (((((((((fVar120 * 0.070376836 + -0.1151461) * fVar120 + 0.116769984) *
                                 fVar120 + -0.12420141) * fVar120 + 0.14249323) * fVar120 +
                              -0.16668057) * fVar120 + 0.20000714) * fVar120 + -0.24999994) *
                            fVar120 + 0.3333333) * fVar120 + -0.5) +
                         auVar156._4_4_ * 0.6931472 + fVar120) * -2.0;
                    auVar78._8_4_ =
                         (fVar136 * fVar136 *
                          (((((((((fVar136 * 0.070376836 + -0.1151461) * fVar136 + 0.116769984) *
                                 fVar136 + -0.12420141) * fVar136 + 0.14249323) * fVar136 +
                              -0.16668057) * fVar136 + 0.20000714) * fVar136 + -0.24999994) *
                            fVar136 + 0.3333333) * fVar136 + -0.5) +
                         auVar156._8_4_ * 0.6931472 + fVar136) * -2.0;
                    auVar78._12_4_ =
                         (fVar138 * fVar138 *
                          (((((((((fVar138 * 0.070376836 + -0.1151461) * fVar138 + 0.116769984) *
                                 fVar138 + -0.12420141) * fVar138 + 0.14249323) * fVar138 +
                              -0.16668057) * fVar138 + 0.20000714) * fVar138 + -0.24999994) *
                            fVar138 + 0.3333333) * fVar138 + -0.5) +
                         auVar156._12_4_ * 0.6931472 + fVar138) * -2.0;
                    auVar98._8_4_ = 0x7fffffff;
                    auVar98._0_8_ = 0x7fffffff7fffffff;
                    auVar98._12_4_ = 0x7fffffff;
                    auVar121 = vblendvps_avx(auVar78,auVar98,auVar121);
                    auVar99._8_4_ = 0x42b0c0a5;
                    auVar99._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar99._12_4_ = 0x42b0c0a5;
                    auVar121 = vminps_avx(auVar121,auVar99);
                    auVar100._8_4_ = 0xc2b0c0a5;
                    auVar100._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar100._12_4_ = 0xc2b0c0a5;
                    auVar111 = vmaxps_avx(auVar121,auVar100);
                    auVar101._0_4_ = auVar111._0_4_ * 1.442695 + 0.5;
                    auVar101._4_4_ = auVar111._4_4_ * 1.442695 + 0.5;
                    auVar101._8_4_ = auVar111._8_4_ * 1.442695 + 0.5;
                    auVar101._12_4_ = auVar111._12_4_ * 1.442695 + 0.5;
                    auVar125._0_4_ = (int)auVar101._0_4_;
                    auVar125._4_4_ = (int)auVar101._4_4_;
                    auVar125._8_4_ = (int)auVar101._8_4_;
                    auVar125._12_4_ = (int)auVar101._12_4_;
                    auVar156 = vcvtdq2ps_avx(auVar125);
                    auVar121 = vcmpps_avx(auVar101,auVar156,1);
                    auVar121 = vandps_avx(auVar121,auVar93);
                    auVar121 = vsubps_avx(auVar156,auVar121);
                    auVar126._0_4_ = auVar121._0_4_ * 0.6931472;
                    auVar126._4_4_ = auVar121._4_4_ * 0.6931472;
                    auVar126._8_4_ = auVar121._8_4_ * 0.6931472;
                    auVar126._12_4_ = auVar121._12_4_ * 0.6931472;
                    auVar109 = ZEXT1664(auVar93);
                    auVar156 = vsubps_avx(auVar111,auVar126);
                    fVar75 = auVar156._0_4_;
                    fVar120 = auVar156._4_4_;
                    fVar136 = auVar156._8_4_;
                    fVar138 = auVar156._12_4_;
                    auVar102._0_4_ = (int)auVar121._0_4_;
                    auVar102._4_4_ = (int)auVar121._4_4_;
                    auVar102._8_4_ = (int)auVar121._8_4_;
                    auVar102._12_4_ = (int)auVar121._12_4_;
                    auVar121 = vpslld_avx(auVar102,0x17);
                    auVar93 = vpaddd_avx(auVar121,auVar93);
                    auVar79._0_4_ =
                         (fVar75 + fVar60 +
                         (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) *
                            fVar75 + 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) *
                         fVar75 * fVar75) * auVar93._0_4_ + fVar60;
                    auVar79._4_4_ =
                         (fVar120 + fVar110 +
                         (((((fVar120 * 0.00019875691 + 0.0013981999) * fVar120 + 0.008333452) *
                            fVar120 + 0.041665796) * fVar120 + 0.16666666) * fVar120 + 0.5) *
                         fVar120 * fVar120) * auVar93._4_4_ + fVar110;
                    auVar79._8_4_ =
                         (fVar136 + fVar3 +
                         (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) *
                            fVar136 + 0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5) *
                         fVar136 * fVar136) * auVar93._8_4_ + fVar3;
                    auVar79._12_4_ =
                         (fVar138 + fVar91 +
                         (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                            fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) *
                         fVar138 * fVar138) * auVar93._12_4_ + fVar91;
                    auVar103._8_4_ = 0x40000000;
                    auVar103._0_8_ = 0x4000000040000000;
                    auVar103._12_4_ = 0x40000000;
                    auVar93 = vdivps_avx(auVar103,auVar79);
                    auVar80._0_4_ = auVar93._0_4_ + -1.0;
                    auVar80._4_4_ = auVar93._4_4_ + -1.0;
                    auVar80._8_4_ = auVar93._8_4_ + -1.0;
                    auVar80._12_4_ = auVar93._12_4_ + -1.0;
                    goto LAB_0046fa82;
                  case 6:
                    pfVar45 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                    fVar60 = *pfVar45;
                    fVar110 = pfVar45[1];
                    auVar83._0_4_ = fVar60 * auVar71._0_4_ + fVar110;
                    auVar83._4_4_ = fVar60 * fVar67 + fVar110;
                    auVar83._8_4_ = fVar60 * fVar73 + fVar110;
                    auVar83._12_4_ = fVar60 * fVar74 + fVar110;
                    auVar121 = vmaxps_avx(auVar83,_DAT_005ef030);
                    auVar80 = vminps_avx(auVar121,auVar93);
LAB_0046fa82:
                    auVar71._0_4_ = auVar80._0_4_ * auVar71._0_4_;
                    auVar71._4_4_ = auVar80._4_4_ * fVar67;
                    auVar71._8_4_ = auVar80._8_4_ * fVar73;
                    auVar71._12_4_ = auVar80._12_4_ * fVar74;
                  }
                  *pauVar50 = auVar71;
                  pauVar50 = pauVar50 + 1;
                  iVar35 = iVar35 + 1;
                  iVar48 = iVar48 + 1;
                } while (iVar35 != iVar39);
              }
              iVar38 = iVar38 + 1;
            } while (iVar38 != iVar46);
          }
          local_2f8 = local_2f8 + 1;
        } while (local_2f8 != uVar59);
      }
    }
    else if ((iVar55 == 8) && (0 < (int)uVar34)) {
      local_218 = CONCAT44(local_218._4_4_,uVar33 * 8);
      auVar93 = vpcmpgtd_avx(local_158,(undefined1  [16])0x0);
      auVar93 = vpmovsxdq_avx(auVar93);
      uVar34 = vmovmskpd_avx(auVar93);
      local_220 = (void *)CONCAT44(local_220._4_4_,uVar34);
      local_2f8 = 0;
      auVar150 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar151 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar152 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar118._8_4_ = 0x3f000000;
      auVar118._0_8_ = 0x3f0000003f000000;
      auVar118._12_4_ = 0x3f000000;
      auVar118._16_4_ = 0x3f000000;
      auVar118._20_4_ = 0x3f000000;
      auVar118._24_4_ = 0x3f000000;
      auVar118._28_4_ = 0x3f000000;
      auVar113 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar153 = ZEXT3264(CONCAT428(0x3c088908,
                                    CONCAT424(0x3c088908,
                                              CONCAT420(0x3c088908,
                                                        CONCAT416(0x3c088908,
                                                                  CONCAT412(0x3c088908,
                                                                            CONCAT48(0x3c088908,
                                                                                                                                                                          
                                                  0x3c0889083c088908)))))));
      do {
        if ((byte)((byte)uVar34 >> 1) != 0) {
          pvVar16 = (this->weight_data_tm).data;
          sVar57 = bottom_blob->cstep;
          sVar17 = bottom_blob->elemsize;
          pvVar53 = bottom_blob->data;
          iVar55 = bottom_blob->w;
          pauVar49 = (undefined1 (*) [32])
                     (local_298.cstep * local_2f8 *
                      CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize) +
                     (long)local_298.data);
          local_210 = (void *)(local_2f8 * 0x20);
          iVar38 = 0;
          do {
            if ((uVar34 & 1) != 0) {
              local_238 = iVar38 - local_a8._4_4_;
              iVar35 = 0;
              iVar48 = -local_a8._0_4_;
              do {
                if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                  auVar159 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar159 = ZEXT3264(*(undefined1 (*) [32])
                                       ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                       (long)local_210));
                }
                iVar40 = (this->super_DeconvolutionDepthWise).kernel_h;
                if (0 < iVar40) {
                  local_248 = (this->super_DeconvolutionDepthWise).stride_h;
                  uVar43 = (this->super_DeconvolutionDepthWise).kernel_w;
                  iVar14 = (this->super_DeconvolutionDepthWise).stride_w;
                  uVar51 = 0;
                  lVar58 = 0;
                  do {
                    iVar36 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar58 +
                             (iVar38 - local_a8._4_4_);
                    if ((((-1 < iVar36) && (iVar36 % (int)local_248 == 0)) &&
                        (iVar36 / (int)local_248 < iVar47)) && (0 < (int)uVar43)) {
                      uVar52 = uVar51;
                      uVar56 = (ulong)uVar43;
                      iVar42 = iVar48;
                      do {
                        if ((-1 < iVar42) &&
                           (iVar37 = iVar42 / iVar14, iVar37 < iVar54 && iVar42 % iVar14 == 0)) {
                          pfVar45 = (float *)((long)pvVar16 +
                                             (uVar52 & 0xffffffff) * 4 +
                                             (long)(int)(uVar33 * 8 * (int)local_2f8) * 4);
                          pfVar1 = (float *)((long)pvVar53 +
                                            (long)(iVar37 << 3) * 4 +
                                            (long)(iVar36 / (int)local_248) * (long)iVar55 * sVar17
                                            + sVar57 * local_2f8 * sVar17);
                          auVar159 = ZEXT3264(CONCAT428(auVar159._28_4_ + pfVar45[7],
                                                        CONCAT424(auVar159._24_4_ +
                                                                  pfVar45[6] * pfVar1[6],
                                                                  CONCAT420(auVar159._20_4_ +
                                                                            pfVar45[5] * pfVar1[5],
                                                                            CONCAT416(auVar159.
                                                  _16_4_ + pfVar45[4] * pfVar1[4],
                                                  CONCAT412(auVar159._12_4_ + pfVar45[3] * pfVar1[3]
                                                            ,CONCAT48(auVar159._8_4_ +
                                                                      pfVar45[2] * pfVar1[2],
                                                                      CONCAT44(auVar159._4_4_ +
                                                                               pfVar45[1] *
                                                                               pfVar1[1],
                                                                               auVar159._0_4_ +
                                                                               *pfVar45 * *pfVar1)))
                                                  )))));
                        }
                        iVar42 = iVar42 + (this->super_DeconvolutionDepthWise).dilation_w;
                        uVar52 = uVar52 + 8;
                        uVar56 = uVar56 - 1;
                      } while (uVar56 != 0);
                    }
                    lVar58 = lVar58 + 1;
                    uVar51 = uVar51 + (ulong)uVar43 * 8;
                  } while (lVar58 != iVar40);
                }
                auVar158 = auVar159._0_32_;
                fVar161 = auVar159._8_4_;
                fVar162 = auVar159._12_4_;
                fVar163 = auVar159._16_4_;
                fVar164 = auVar159._20_4_;
                fVar165 = auVar159._24_4_;
                fVar120 = auVar152._0_4_;
                fVar136 = auVar152._4_4_;
                fVar138 = auVar152._8_4_;
                fVar140 = auVar152._12_4_;
                fVar142 = auVar152._16_4_;
                fVar144 = auVar152._20_4_;
                fVar146 = auVar152._24_4_;
                auVar65 = auVar113._0_32_;
                fVar119 = auVar153._0_4_;
                fVar135 = auVar153._4_4_;
                fVar137 = auVar153._8_4_;
                fVar139 = auVar153._12_4_;
                fVar141 = auVar153._16_4_;
                fVar143 = auVar153._20_4_;
                fVar145 = auVar153._24_4_;
                fVar154 = auVar153._28_4_;
                auVar90 = auVar151._0_32_;
                fVar60 = auVar113._0_4_;
                fVar110 = auVar113._4_4_;
                fVar3 = auVar113._8_4_;
                fVar91 = auVar113._12_4_;
                fVar67 = auVar113._16_4_;
                fVar73 = auVar113._20_4_;
                fVar74 = auVar113._24_4_;
                fVar75 = auVar113._28_4_;
                auVar160._28_36_ = auVar159._28_36_;
                switch((this->super_DeconvolutionDepthWise).activation_type) {
                case 1:
                  auVar158 = vmaxps_avx(auVar158,auVar150._0_32_);
                  break;
                case 2:
                  auVar65 = vmaxps_avx(auVar158,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  in_ZMM7 = ZEXT3264(auVar65);
                  auVar150 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar90 = vminps_avx(auVar158,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  fVar60 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar158._0_4_ = fVar60 * auVar90._0_4_ + auVar65._0_4_;
                  auVar158._4_4_ = fVar60 * auVar90._4_4_ + auVar65._4_4_;
                  auVar158._8_4_ = fVar60 * auVar90._8_4_ + auVar65._8_4_;
                  auVar158._12_4_ = fVar60 * auVar90._12_4_ + auVar65._12_4_;
                  auVar158._16_4_ = fVar60 * auVar90._16_4_ + auVar65._16_4_;
                  auVar158._20_4_ = fVar60 * auVar90._20_4_ + auVar65._20_4_;
                  auVar158._24_4_ = fVar60 * auVar90._24_4_ + auVar65._24_4_;
                  auVar158._28_4_ = auVar90._28_4_ + auVar65._28_4_;
                  break;
                case 3:
                  puVar18 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar2 = *puVar18;
                  auVar132._4_4_ = uVar2;
                  auVar132._0_4_ = uVar2;
                  auVar132._8_4_ = uVar2;
                  auVar132._12_4_ = uVar2;
                  auVar132._16_4_ = uVar2;
                  auVar132._20_4_ = uVar2;
                  auVar132._24_4_ = uVar2;
                  auVar132._28_4_ = uVar2;
                  uVar2 = puVar18[1];
                  auVar171._4_4_ = uVar2;
                  auVar171._0_4_ = uVar2;
                  auVar171._8_4_ = uVar2;
                  auVar171._12_4_ = uVar2;
                  auVar171._16_4_ = uVar2;
                  auVar171._20_4_ = uVar2;
                  auVar171._24_4_ = uVar2;
                  auVar171._28_4_ = uVar2;
                  auVar158 = vmaxps_avx(auVar158,auVar132);
                  in_ZMM7 = ZEXT3264(auVar158);
                  auVar158 = vminps_avx(auVar171,auVar158);
                  break;
                case 4:
                  auVar133._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
                  auVar133._8_4_ = -fVar161;
                  auVar133._12_4_ = -fVar162;
                  auVar133._16_4_ = -fVar163;
                  auVar133._20_4_ = -fVar164;
                  auVar133._24_4_ = -fVar165;
                  auVar133._28_4_ = -auVar159._28_4_;
                  auVar66._8_4_ = 0x42b0c0a5;
                  auVar66._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar66._12_4_ = 0x42b0c0a5;
                  auVar66._16_4_ = 0x42b0c0a5;
                  auVar66._20_4_ = 0x42b0c0a5;
                  auVar66._24_4_ = 0x42b0c0a5;
                  auVar66._28_4_ = 0x42b0c0a5;
                  auVar158 = vminps_avx(auVar133,auVar66);
                  auVar90 = vmaxps_avx(auVar90,auVar158);
                  auVar157._0_4_ = fVar120 * auVar90._0_4_ + 0.5;
                  auVar157._4_4_ = fVar136 * auVar90._4_4_ + 0.5;
                  auVar157._8_4_ = fVar138 * auVar90._8_4_ + 0.5;
                  auVar157._12_4_ = fVar140 * auVar90._12_4_ + 0.5;
                  auVar157._16_4_ = fVar142 * auVar90._16_4_ + 0.5;
                  auVar157._20_4_ = fVar144 * auVar90._20_4_ + 0.5;
                  auVar157._24_4_ = fVar146 * auVar90._24_4_ + 0.5;
                  auVar157._28_4_ = auVar159._28_4_ + 0.5;
                  auVar108 = vroundps_avx(auVar157,1);
                  auVar158 = vcmpps_avx(auVar157,auVar108,1);
                  auVar158 = vandps_avx(auVar158,auVar65);
                  auVar158 = vsubps_avx(auVar108,auVar158);
                  fVar120 = auVar158._0_4_ * -0.6931472 + auVar90._0_4_;
                  fVar136 = auVar158._4_4_ * -0.6931472 + auVar90._4_4_;
                  fVar138 = auVar158._8_4_ * -0.6931472 + auVar90._8_4_;
                  fVar140 = auVar158._12_4_ * -0.6931472 + auVar90._12_4_;
                  fVar142 = auVar158._16_4_ * -0.6931472 + auVar90._16_4_;
                  fVar144 = auVar158._20_4_ * -0.6931472 + auVar90._20_4_;
                  fVar146 = auVar158._24_4_ * -0.6931472 + auVar90._24_4_;
                  auVar122._0_4_ = (int)auVar158._0_4_;
                  auVar122._4_4_ = (int)auVar158._4_4_;
                  auVar122._8_4_ = (int)auVar158._8_4_;
                  auVar122._12_4_ = (int)auVar158._12_4_;
                  auVar134._16_4_ = (int)auVar158._16_4_;
                  auVar134._0_16_ = auVar122;
                  auVar134._20_4_ = (int)auVar158._20_4_;
                  auVar134._24_4_ = (int)auVar158._24_4_;
                  auVar134._28_4_ = (int)auVar158._28_4_;
                  auVar121 = vpslld_avx(auVar122,0x17);
                  auVar93 = vpslld_avx(auVar134._16_16_,0x17);
                  auVar68._8_4_ = 0x3f800000;
                  auVar68._0_8_ = 0x3f8000003f800000;
                  auVar68._12_4_ = 0x3f800000;
                  auVar93 = vpaddd_avx(auVar93,auVar68);
                  auVar121 = vpaddd_avx(auVar121,auVar68);
                  in_ZMM7 = ZEXT3264(CONCAT1616(auVar93,auVar121));
                  auVar89._0_4_ =
                       (fVar120 + fVar60 +
                       fVar120 * fVar120 *
                       ((((fVar119 + (fVar120 * 0.00019875691 + 0.0013981999) * fVar120) * fVar120 +
                         0.041665796) * fVar120 + 0.16666666) * fVar120 + 0.5)) * auVar121._0_4_ +
                       fVar60;
                  auVar89._4_4_ =
                       (fVar136 + fVar110 +
                       fVar136 * fVar136 *
                       ((((fVar135 + (fVar136 * 0.00019875691 + 0.0013981999) * fVar136) * fVar136 +
                         0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar121._4_4_ +
                       fVar110;
                  auVar89._8_4_ =
                       (fVar138 + fVar3 +
                       fVar138 * fVar138 *
                       ((((fVar137 + (fVar138 * 0.00019875691 + 0.0013981999) * fVar138) * fVar138 +
                         0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar121._8_4_ +
                       fVar3;
                  auVar89._12_4_ =
                       (fVar140 + fVar91 +
                       fVar140 * fVar140 *
                       ((((fVar139 + (fVar140 * 0.00019875691 + 0.0013981999) * fVar140) * fVar140 +
                         0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar121._12_4_ +
                       fVar91;
                  auVar89._16_4_ =
                       (fVar142 + fVar67 +
                       fVar142 * fVar142 *
                       ((((fVar141 + (fVar142 * 0.00019875691 + 0.0013981999) * fVar142) * fVar142 +
                         0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5)) * auVar93._0_4_ +
                       fVar67;
                  auVar89._20_4_ =
                       (fVar144 + fVar73 +
                       fVar144 * fVar144 *
                       ((((fVar143 + (fVar144 * 0.00019875691 + 0.0013981999) * fVar144) * fVar144 +
                         0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5)) * auVar93._4_4_ +
                       fVar73;
                  auVar89._24_4_ =
                       (fVar146 + fVar74 +
                       fVar146 * fVar146 *
                       ((((fVar145 + (fVar146 * 0.00019875691 + 0.0013981999) * fVar146) * fVar146 +
                         0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5)) * auVar93._8_4_ +
                       fVar74;
                  auVar89._28_4_ =
                       auVar108._28_4_ + auVar90._28_4_ + fVar75 +
                       fVar154 + -0.691749 + 0.041665796 + 0.16666666 + 0.5 + fVar75;
                  auVar158 = vdivps_avx(auVar65,auVar89);
                  break;
                case 5:
                  auVar149._8_4_ = 0x42b0c0a5;
                  auVar149._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar149._12_4_ = 0x42b0c0a5;
                  auVar149._16_4_ = 0x42b0c0a5;
                  auVar149._20_4_ = 0x42b0c0a5;
                  auVar149._24_4_ = 0x42b0c0a5;
                  auVar149._28_4_ = 0x42b0c0a5;
                  auVar158 = vminps_avx(auVar158,auVar149);
                  auVar108 = vmaxps_avx(auVar90,auVar158);
                  auVar130._0_4_ = fVar120 * auVar108._0_4_ + 0.5;
                  auVar130._4_4_ = fVar136 * auVar108._4_4_ + 0.5;
                  auVar130._8_4_ = fVar138 * auVar108._8_4_ + 0.5;
                  auVar130._12_4_ = fVar140 * auVar108._12_4_ + 0.5;
                  auVar130._16_4_ = fVar142 * auVar108._16_4_ + 0.5;
                  auVar130._20_4_ = fVar144 * auVar108._20_4_ + 0.5;
                  auVar130._24_4_ = fVar146 * auVar108._24_4_ + 0.5;
                  auVar130._28_4_ = in_ZMM7._28_4_ + 0.5;
                  auVar62 = vroundps_avx(auVar130,1);
                  auVar158 = vcmpps_avx(auVar130,auVar62,1);
                  auVar158 = vandps_avx(auVar158,auVar65);
                  auVar158 = vsubps_avx(auVar62,auVar158);
                  auVar21._4_4_ = auVar158._4_4_ * 0.6931472;
                  auVar21._0_4_ = auVar158._0_4_ * 0.6931472;
                  auVar21._8_4_ = auVar158._8_4_ * 0.6931472;
                  auVar21._12_4_ = auVar158._12_4_ * 0.6931472;
                  auVar21._16_4_ = auVar158._16_4_ * 0.6931472;
                  auVar21._20_4_ = auVar158._20_4_ * 0.6931472;
                  auVar21._24_4_ = auVar158._24_4_ * 0.6931472;
                  auVar21._28_4_ = auVar62._28_4_;
                  auVar108 = vsubps_avx(auVar108,auVar21);
                  fVar166 = auVar108._0_4_;
                  fVar172 = auVar108._4_4_;
                  fVar173 = auVar108._8_4_;
                  fVar174 = auVar108._12_4_;
                  fVar175 = auVar108._16_4_;
                  fVar176 = auVar108._20_4_;
                  fVar177 = auVar108._24_4_;
                  auVar92._0_4_ = (int)auVar158._0_4_;
                  auVar92._4_4_ = (int)auVar158._4_4_;
                  auVar92._8_4_ = (int)auVar158._8_4_;
                  auVar92._12_4_ = (int)auVar158._12_4_;
                  auVar104._16_4_ = (int)auVar158._16_4_;
                  auVar104._0_16_ = auVar92;
                  auVar104._20_4_ = (int)auVar158._20_4_;
                  auVar104._24_4_ = (int)auVar158._24_4_;
                  auVar104._28_4_ = (int)auVar158._28_4_;
                  auVar121 = vpslld_avx(auVar92,0x17);
                  auVar93 = vpslld_avx(auVar104._16_16_,0x17);
                  auVar115._8_4_ = 0x3f800000;
                  auVar115._0_8_ = 0x3f8000003f800000;
                  auVar115._12_4_ = 0x3f800000;
                  auVar93 = vpaddd_avx(auVar93,auVar115);
                  auVar121 = vpaddd_avx(auVar121,auVar115);
                  auVar131._0_4_ =
                       (fVar166 + fVar60 +
                       fVar166 * fVar166 *
                       ((((fVar119 + (fVar166 * 0.00019875691 + 0.0013981999) * fVar166) * fVar166 +
                         0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5)) * auVar121._0_4_ +
                       fVar60;
                  auVar131._4_4_ =
                       (fVar172 + fVar110 +
                       fVar172 * fVar172 *
                       ((((fVar135 + (fVar172 * 0.00019875691 + 0.0013981999) * fVar172) * fVar172 +
                         0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5)) * auVar121._4_4_ +
                       fVar110;
                  auVar131._8_4_ =
                       (fVar173 + fVar3 +
                       fVar173 * fVar173 *
                       ((((fVar137 + (fVar173 * 0.00019875691 + 0.0013981999) * fVar173) * fVar173 +
                         0.041665796) * fVar173 + 0.16666666) * fVar173 + 0.5)) * auVar121._8_4_ +
                       fVar3;
                  auVar131._12_4_ =
                       (fVar174 + fVar91 +
                       fVar174 * fVar174 *
                       ((((fVar139 + (fVar174 * 0.00019875691 + 0.0013981999) * fVar174) * fVar174 +
                         0.041665796) * fVar174 + 0.16666666) * fVar174 + 0.5)) * auVar121._12_4_ +
                       fVar91;
                  auVar131._16_4_ =
                       (fVar175 + fVar67 +
                       fVar175 * fVar175 *
                       ((((fVar141 + (fVar175 * 0.00019875691 + 0.0013981999) * fVar175) * fVar175 +
                         0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5)) * auVar93._0_4_ +
                       fVar67;
                  auVar131._20_4_ =
                       (fVar176 + fVar73 +
                       fVar176 * fVar176 *
                       ((((fVar143 + (fVar176 * 0.00019875691 + 0.0013981999) * fVar176) * fVar176 +
                         0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5)) * auVar93._4_4_ +
                       fVar73;
                  auVar131._24_4_ =
                       (fVar177 + fVar74 +
                       fVar177 * fVar177 *
                       ((((fVar145 + (fVar177 * 0.00019875691 + 0.0013981999) * fVar177) * fVar177 +
                         0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5)) * auVar93._8_4_ +
                       fVar74;
                  auVar131._28_4_ =
                       auVar108._28_4_ + fVar75 +
                       fVar154 + auVar109._28_4_ + 0.0013981999 + 0.041665796 + 0.16666666 + 0.5 +
                       fVar75;
                  auVar62._8_4_ = 0x800000;
                  auVar62._0_8_ = 0x80000000800000;
                  auVar62._12_4_ = 0x800000;
                  auVar62._16_4_ = 0x800000;
                  auVar62._20_4_ = 0x800000;
                  auVar62._24_4_ = 0x800000;
                  auVar62._28_4_ = 0x800000;
                  auVar62 = vmaxps_avx(auVar131,auVar62);
                  auVar93 = vpsrld_avx(auVar62._16_16_,0x17);
                  auVar63._8_4_ = 0x807fffff;
                  auVar63._0_8_ = 0x807fffff807fffff;
                  auVar63._12_4_ = 0x807fffff;
                  auVar63._16_4_ = 0x807fffff;
                  auVar63._20_4_ = 0x807fffff;
                  auVar63._24_4_ = 0x807fffff;
                  auVar63._28_4_ = 0x807fffff;
                  auVar158 = vandps_avx(auVar62,auVar63);
                  auVar21 = vorps_avx(auVar158,auVar118);
                  auVar64._8_4_ = 0x3f3504f3;
                  auVar64._0_8_ = 0x3f3504f33f3504f3;
                  auVar64._12_4_ = 0x3f3504f3;
                  auVar64._16_4_ = 0x3f3504f3;
                  auVar64._20_4_ = 0x3f3504f3;
                  auVar64._24_4_ = 0x3f3504f3;
                  auVar64._28_4_ = 0x3f3504f3;
                  auVar108 = vcmpps_avx(auVar64,auVar21,2);
                  auVar158 = vandnps_avx(auVar108,auVar21);
                  fVar166 = auVar21._0_4_ + -1.0 + auVar158._0_4_;
                  fVar172 = auVar21._4_4_ + -1.0 + auVar158._4_4_;
                  fVar173 = auVar21._8_4_ + -1.0 + auVar158._8_4_;
                  fVar174 = auVar21._12_4_ + -1.0 + auVar158._12_4_;
                  fVar175 = auVar21._16_4_ + -1.0 + auVar158._16_4_;
                  fVar176 = auVar21._20_4_ + -1.0 + auVar158._20_4_;
                  fVar177 = auVar21._24_4_ + -1.0 + auVar158._24_4_;
                  auVar93 = vpsubd_avx(auVar93,auVar108._16_16_);
                  auVar121 = vpsrld_avx(auVar62._0_16_,0x17);
                  auVar147._8_4_ = 0xffffff81;
                  auVar147._0_8_ = 0xffffff81ffffff81;
                  auVar147._12_4_ = 0xffffff81;
                  auVar93 = vpaddd_avx(auVar147,auVar93);
                  auVar121 = vpsubd_avx(auVar121,auVar108._0_16_);
                  auVar121 = vpaddd_avx(auVar147,auVar121);
                  auVar87._16_16_ = auVar93;
                  auVar87._0_16_ = auVar121;
                  auVar150 = ZEXT864(0) << 0x20;
                  auVar108 = vcmpps_avx(auVar131,_DAT_005f32a0,2);
                  auVar62 = vcvtdq2ps_avx(auVar87);
                  auVar22._4_4_ =
                       (fVar172 + auVar62._4_4_ * 0.6931472 +
                       fVar172 * fVar172 *
                       (fVar172 * (fVar172 * (fVar172 * (fVar172 * (fVar172 * (fVar172 * (fVar172 * 
                                                  (fVar172 * (fVar172 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar22._0_4_ =
                       (fVar166 + auVar62._0_4_ * 0.6931472 +
                       fVar166 * fVar166 *
                       (fVar166 * (fVar166 * (fVar166 * (fVar166 * (fVar166 * (fVar166 * (fVar166 * 
                                                  (fVar166 * (fVar166 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar22._8_4_ =
                       (fVar173 + auVar62._8_4_ * 0.6931472 +
                       fVar173 * fVar173 *
                       (fVar173 * (fVar173 * (fVar173 * (fVar173 * (fVar173 * (fVar173 * (fVar173 * 
                                                  (fVar173 * (fVar173 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar22._12_4_ =
                       (fVar174 + auVar62._12_4_ * 0.6931472 +
                       fVar174 * fVar174 *
                       (fVar174 * (fVar174 * (fVar174 * (fVar174 * (fVar174 * (fVar174 * (fVar174 * 
                                                  (fVar174 * (fVar174 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar22._16_4_ =
                       (fVar175 + auVar62._16_4_ * 0.6931472 +
                       fVar175 * fVar175 *
                       (fVar175 * (fVar175 * (fVar175 * (fVar175 * (fVar175 * (fVar175 * (fVar175 * 
                                                  (fVar175 * (fVar175 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar22._20_4_ =
                       (fVar176 + auVar62._20_4_ * 0.6931472 +
                       fVar176 * fVar176 *
                       (fVar176 * (fVar176 * (fVar176 * (fVar176 * (fVar176 * (fVar176 * (fVar176 * 
                                                  (fVar176 * (fVar176 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar22._24_4_ =
                       (fVar177 + auVar62._24_4_ * 0.6931472 +
                       fVar177 * fVar177 *
                       (fVar177 * (fVar177 * (fVar177 * (fVar177 * (fVar177 * (fVar177 * (fVar177 * 
                                                  (fVar177 * (fVar177 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar22._28_4_ = auVar21._28_4_ + -1.0 + auVar158._28_4_ + auVar62._28_4_ + 0.0;
                  auVar105._8_4_ = 0x7fffffff;
                  auVar105._0_8_ = 0x7fffffff7fffffff;
                  auVar105._12_4_ = 0x7fffffff;
                  auVar105._16_4_ = 0x7fffffff;
                  auVar105._20_4_ = 0x7fffffff;
                  auVar105._24_4_ = 0x7fffffff;
                  auVar105._28_4_ = 0x7fffffff;
                  auVar158 = vblendvps_avx(auVar22,auVar105,auVar108);
                  auVar158 = vminps_avx(auVar149,auVar158);
                  auVar151 = ZEXT3264(auVar90);
                  auVar90 = vmaxps_avx(auVar90,auVar158);
                  auVar152 = ZEXT3264(auVar152._0_32_);
                  auVar106._0_4_ = fVar120 * auVar90._0_4_ + 0.5;
                  auVar106._4_4_ = fVar136 * auVar90._4_4_ + 0.5;
                  auVar106._8_4_ = fVar138 * auVar90._8_4_ + 0.5;
                  auVar106._12_4_ = fVar140 * auVar90._12_4_ + 0.5;
                  auVar106._16_4_ = fVar142 * auVar90._16_4_ + 0.5;
                  auVar106._20_4_ = fVar144 * auVar90._20_4_ + 0.5;
                  auVar106._24_4_ = fVar146 * auVar90._24_4_ + 0.5;
                  auVar106._28_4_ = 0x7fc00000;
                  auVar62 = vroundps_avx(auVar106,1);
                  auVar158 = vcmpps_avx(auVar106,auVar62,1);
                  auVar158 = vandps_avx(auVar158,auVar65);
                  auVar158 = vsubps_avx(auVar62,auVar158);
                  auVar23._4_4_ = auVar158._4_4_ * 0.6931472;
                  auVar23._0_4_ = auVar158._0_4_ * 0.6931472;
                  auVar23._8_4_ = auVar158._8_4_ * 0.6931472;
                  auVar23._12_4_ = auVar158._12_4_ * 0.6931472;
                  auVar23._16_4_ = auVar158._16_4_ * 0.6931472;
                  auVar23._20_4_ = auVar158._20_4_ * 0.6931472;
                  auVar23._24_4_ = auVar158._24_4_ * 0.6931472;
                  auVar23._28_4_ = auVar62._28_4_;
                  auVar90 = vsubps_avx(auVar90,auVar23);
                  fVar120 = auVar90._0_4_;
                  fVar136 = auVar90._4_4_;
                  fVar138 = auVar90._8_4_;
                  fVar140 = auVar90._12_4_;
                  fVar142 = auVar90._16_4_;
                  fVar144 = auVar90._20_4_;
                  fVar146 = auVar90._24_4_;
                  auVar153 = ZEXT3264(auVar153._0_32_);
                  fVar119 = ((((fVar120 * 0.00019875691 + 0.0013981999) * fVar120 + fVar119) *
                              fVar120 + 0.041665796) * fVar120 + 0.16666666) * fVar120 + 0.5;
                  fVar135 = ((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + fVar135) *
                              fVar136 + 0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5;
                  fVar137 = ((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + fVar137) *
                              fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5;
                  fVar139 = ((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + fVar139) *
                              fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5;
                  fVar141 = ((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + fVar141) *
                              fVar142 + 0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5;
                  fVar143 = ((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + fVar143) *
                              fVar144 + 0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5;
                  fVar145 = ((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + fVar145) *
                              fVar146 + 0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5;
                  in_ZMM7 = ZEXT3264(CONCAT428(auVar131._28_4_ + 0.0013981999 + fVar154 +
                                               0.041665796 + 0.16666666 + 0.5,
                                               CONCAT424(fVar145,CONCAT420(fVar143,CONCAT416(fVar141
                                                  ,CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(
                                                  fVar135,fVar119))))))));
                  auVar94._0_4_ = (int)auVar158._0_4_;
                  auVar94._4_4_ = (int)auVar158._4_4_;
                  auVar94._8_4_ = (int)auVar158._8_4_;
                  auVar94._12_4_ = (int)auVar158._12_4_;
                  auVar107._16_4_ = (int)auVar158._16_4_;
                  auVar107._0_16_ = auVar94;
                  auVar107._20_4_ = (int)auVar158._20_4_;
                  auVar107._24_4_ = (int)auVar158._24_4_;
                  auVar107._28_4_ = (int)auVar158._28_4_;
                  auVar121 = vpslld_avx(auVar94,0x17);
                  auVar93 = vpslld_avx(auVar107._16_16_,0x17);
                  auVar61._8_4_ = 0x3f800000;
                  auVar61._0_8_ = 0x3f8000003f800000;
                  auVar61._12_4_ = 0x3f800000;
                  auVar93 = vpaddd_avx(auVar93,auVar61);
                  auVar121 = vpaddd_avx(auVar121,auVar61);
                  auVar108._16_16_ = auVar93;
                  auVar108._0_16_ = auVar121;
                  auVar113 = ZEXT3264(auVar65);
                  auVar88._0_4_ =
                       (fVar120 + fVar60 + fVar120 * fVar120 * fVar119) * auVar121._0_4_ + fVar60;
                  auVar88._4_4_ =
                       (fVar136 + fVar110 + fVar136 * fVar136 * fVar135) * auVar121._4_4_ + fVar110;
                  auVar88._8_4_ =
                       (fVar138 + fVar3 + fVar138 * fVar138 * fVar137) * auVar121._8_4_ + fVar3;
                  auVar88._12_4_ =
                       (fVar140 + fVar91 + fVar140 * fVar140 * fVar139) * auVar121._12_4_ + fVar91;
                  auVar88._16_4_ =
                       (fVar142 + fVar67 + fVar142 * fVar142 * fVar141) * auVar93._0_4_ + fVar67;
                  auVar88._20_4_ =
                       (fVar144 + fVar73 + fVar144 * fVar144 * fVar143) * auVar93._4_4_ + fVar73;
                  auVar88._24_4_ =
                       (fVar146 + fVar74 + fVar146 * fVar146 * fVar145) * auVar93._8_4_ + fVar74;
                  auVar88._28_4_ = auVar90._28_4_ + fVar75 + auVar62._28_4_ + fVar75;
                  auVar65._8_4_ = 0x40000000;
                  auVar65._0_8_ = 0x4000000040000000;
                  auVar65._12_4_ = 0x40000000;
                  auVar65._16_4_ = 0x40000000;
                  auVar65._20_4_ = 0x40000000;
                  auVar65._24_4_ = 0x40000000;
                  auVar65._28_4_ = 0x40000000;
                  auVar158 = vdivps_avx(auVar65,auVar88);
                  auVar86._0_4_ = auVar158._0_4_ + -1.0;
                  auVar86._4_4_ = auVar158._4_4_ + -1.0;
                  auVar86._8_4_ = auVar158._8_4_ + -1.0;
                  auVar86._12_4_ = auVar158._12_4_ + -1.0;
                  auVar86._16_4_ = auVar158._16_4_ + -1.0;
                  auVar86._20_4_ = auVar158._20_4_ + -1.0;
                  auVar86._24_4_ = auVar158._24_4_ + -1.0;
                  goto LAB_0046f350;
                case 6:
                  pfVar45 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                  fVar60 = *pfVar45;
                  fVar110 = pfVar45[1];
                  auVar108._4_4_ = fVar110;
                  auVar108._0_4_ = fVar110;
                  auVar108._8_4_ = fVar110;
                  auVar108._12_4_ = fVar110;
                  auVar108._16_4_ = fVar110;
                  auVar108._20_4_ = fVar110;
                  auVar108._24_4_ = fVar110;
                  auVar108._28_4_ = fVar110;
                  auVar90._0_4_ = auVar159._0_4_ * fVar60 + fVar110;
                  auVar90._4_4_ = auVar159._4_4_ * fVar60 + fVar110;
                  auVar90._8_4_ = fVar161 * fVar60 + fVar110;
                  auVar90._12_4_ = fVar162 * fVar60 + fVar110;
                  auVar90._16_4_ = fVar163 * fVar60 + fVar110;
                  auVar90._20_4_ = fVar164 * fVar60 + fVar110;
                  auVar90._24_4_ = fVar165 * fVar60 + fVar110;
                  auVar90._28_4_ = fVar60 + fVar110;
                  auVar158 = vmaxps_avx(auVar150._0_32_,auVar90);
                  auVar158 = vminps_avx(auVar158,auVar65);
                  auVar86 = auVar158._0_28_;
LAB_0046f350:
                  auVar109 = ZEXT3264(auVar108);
                  auVar160._0_4_ = auVar159._0_4_ * auVar86._0_4_;
                  auVar160._4_4_ = auVar159._4_4_ * auVar86._4_4_;
                  auVar160._8_4_ = fVar161 * auVar86._8_4_;
                  auVar160._12_4_ = fVar162 * auVar86._12_4_;
                  auVar160._16_4_ = fVar163 * auVar86._16_4_;
                  auVar160._20_4_ = fVar164 * auVar86._20_4_;
                  auVar160._24_4_ = fVar165 * auVar86._24_4_;
                  auVar158 = auVar160._0_32_;
                }
                *pauVar49 = auVar158;
                pauVar49 = pauVar49 + 1;
                iVar35 = iVar35 + 1;
                iVar48 = iVar48 + 1;
              } while (iVar35 != iVar39);
            }
            iVar38 = iVar38 + 1;
          } while (iVar38 != iVar46);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != uVar59);
    }
  }
  else {
    local_238 = (int)(uVar34 * iVar55) / iVar54;
    local_248 = iVar47 / iVar54;
    local_2c8 = 1;
    local_2d8 = 1;
    if (opt->use_packing_layout == true) {
      local_2c8 = (uint)((local_238 & 3) == 0) * 3 + 1;
      if ((local_238 & 7) == 0) {
        local_2c8 = 8;
      }
      local_2d8 = (uint)((local_248 & 3) == 0) * 3 + 1;
      if ((local_248 & 7) == 0) {
        local_2d8 = 8;
      }
    }
    piVar15 = bottom_blob->refcount;
    local_1b8._0_8_ = bottom_blob->data;
    local_1b8._8_4_ = SUB84(bottom_blob->refcount,0);
    local_1b8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    local_1b8._16_8_ = bottom_blob->elemsize;
    local_1b8._24_4_ = bottom_blob->elempack;
    local_1b8._32_8_ = bottom_blob->allocator;
    local_190._0_4_ = bottom_blob->dims;
    local_190._4_4_ = bottom_blob->w;
    local_190._8_4_ = bottom_blob->h;
    local_190._12_4_ = bottom_blob->d;
    local_180 = bottom_blob->c;
    local_178 = bottom_blob->cstep;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    if (local_2c8 < iVar55) {
      local_208._0_8_ = *(undefined8 *)opt;
      local_208._16_8_ = opt->workspace_allocator;
      uVar24 = opt->openmp_blocktime;
      uVar25 = opt->use_winograd_convolution;
      uVar27 = opt->use_sgemm_convolution;
      uVar29 = opt->use_int8_inference;
      uVar31 = opt->use_vulkan_compute;
      uVar30 = CONCAT11(uVar31,uVar29);
      uVar28 = CONCAT21(uVar30,uVar27);
      uVar26 = CONCAT31(uVar28,uVar25);
      local_208._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
      auStack_1e0._0_4_ = opt->vulkan_device_index;
      auStack_1e0[4] = opt->use_reserved_1;
      auStack_1e0[5] = opt->use_image_storage;
      auStack_1e0[6] = opt->use_tensor_storage;
      auStack_1e0[7] = opt->use_reserved_2;
      auStack_1e0._8_4_ = opt->flush_denormals;
      auStack_1e0[0xc] = opt->use_local_pool_allocator;
      auStack_1e0[0xd] = opt->use_shader_local_memory;
      auStack_1e0[0xe] = opt->use_cooperative_matrix;
      auStack_1e0[0xf] = opt->use_winograd23_convolution;
      uStack_1d0._0_1_ = opt->use_winograd43_convolution;
      uStack_1d0._1_1_ = opt->use_winograd63_convolution;
      uStack_1d0._2_1_ = opt->use_a53_a55_optimized_kernel;
      uStack_1d0._3_1_ = opt->use_fp16_uniform;
      uStack_1d0._4_1_ = opt->use_int8_uniform;
      uStack_1d0._5_1_ = opt->use_reserved_9;
      uStack_1d0._6_1_ = opt->use_reserved_10;
      uStack_1d0._7_1_ = opt->use_reserved_11;
      local_208._8_4_ = SUB84(opt->workspace_allocator,0);
      local_208._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_208._24_4_ = uVar24;
      local_208._28_4_ = uVar26;
      convert_packing(bottom_blob,(Mat *)local_1b8,local_2c8,(Option *)local_208);
      if (((void *)local_1b8._0_8_ != (void *)0x0) && ((long)local_180 * local_178 != 0))
      goto LAB_0046fc5c;
      bVar20 = false;
      iVar47 = -100;
    }
    else {
LAB_0046fc5c:
      piVar15 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
      local_208._0_8_ = local_298.data;
      local_208._8_4_ = local_298.refcount._0_4_;
      local_208._12_4_ = local_298.refcount._4_4_;
      local_208._16_8_ = CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
      local_208._24_4_ = local_298.elempack;
      local_208._32_8_ = local_298.allocator;
      auStack_1e0._4_4_ = local_298.w;
      auStack_1e0._0_4_ = local_298.dims;
      auStack_1e0._8_4_ = local_298.h;
      auStack_1e0._12_4_ = local_298.d;
      uStack_1d0 = CONCAT44(uStack_1d0._4_4_,local_298.c);
      local_1c8 = local_298.cstep;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      if ((local_2d8 < uVar33) &&
         ((Mat::create((Mat *)local_208,iVar39,iVar46,
                       (this->super_DeconvolutionDepthWise).num_output / (int)local_2d8,
                       (ulong)local_2d8 * (sVar57 / uVar33),local_2d8,opt->workspace_allocator),
          (void *)local_208._0_8_ == (void *)0x0 || ((long)(int)uStack_1d0 * local_1c8 == 0)))) {
LAB_00470530:
        bVar20 = false;
        iVar47 = -100;
      }
      else {
        iVar47 = (this->super_DeconvolutionDepthWise).group;
        bVar20 = 0 < iVar47;
        if (iVar47 < 1) {
          iVar47 = -100;
        }
        else {
          iVar46 = (int)local_238 / local_2c8;
          iVar39 = (int)local_248 / (int)local_2d8;
          iVar47 = -100;
          iVar55 = 0;
          iVar54 = 0;
          lVar58 = 0;
          do {
            local_f8 = (void *)((long)(iVar55 / local_2c8) * local_178 * local_1b8._16_8_ +
                               local_1b8._0_8_);
            uStack_f0 = 0;
            uStack_ec = 0;
            local_e8 = local_1b8._16_8_;
            local_e0 = local_1b8._24_4_;
            local_d8 = (Allocator *)local_1b8._32_8_;
            local_b8 = ((long)(int)local_190._12_4_ * local_1b8._16_8_ *
                        (long)(int)local_190._8_4_ * (long)(int)local_190._4_4_ + 0xfU &
                       0xfffffffffffffff0) / (ulong)local_1b8._16_8_;
            local_d0 = local_190;
            local_148 = (void *)((long)(iVar54 / (int)local_2d8) * local_1c8 * local_208._16_8_ +
                                local_208._0_8_);
            uStack_140 = 0;
            uStack_13c = 0;
            local_138 = (Allocator *)local_208._16_8_;
            local_130 = local_208._24_4_;
            local_128 = (Allocator *)local_208._32_8_;
            local_108 = ((long)(int)auStack_1e0._12_4_ * local_208._16_8_ *
                         (long)(int)auStack_1e0._8_4_ * (long)(int)auStack_1e0._4_4_ + 0xfU &
                        0xfffffffffffffff0) / (ulong)local_208._16_8_;
            local_120 = auStack_1e0;
            pLVar19 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar58];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = (Allocator *)local_208._32_8_;
            local_110 = iVar39;
            local_c0 = iVar46;
            iVar38 = (*pLVar19->_vptr_Layer[7])(pLVar19,&local_f8,&local_148,&local_78);
            if (iVar38 != 0) {
              iVar47 = iVar38;
            }
            piVar15 = (int *)CONCAT44(uStack_13c,uStack_140);
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + -1;
              UNLOCK();
              if (*piVar15 == 0) {
                if (local_128 == (Allocator *)0x0) {
                  if (local_148 != (void *)0x0) {
                    free(local_148);
                  }
                }
                else {
                  (*local_128->_vptr_Allocator[3])();
                }
              }
            }
            local_108 = 0;
            local_148 = (void *)0x0;
            uStack_140 = 0;
            uStack_13c = 0;
            local_138 = (Allocator *)0x0;
            local_130 = 0;
            local_120 = (undefined1  [16])0x0;
            local_110 = 0;
            piVar15 = (int *)CONCAT44(uStack_ec,uStack_f0);
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + -1;
              UNLOCK();
              if (*piVar15 == 0) {
                if (local_d8 == (Allocator *)0x0) {
                  if (local_f8 != (void *)0x0) {
                    free(local_f8);
                  }
                }
                else {
                  (*local_d8->_vptr_Allocator[3])();
                }
              }
            }
            local_b8 = 0;
            local_f8 = (void *)0x0;
            uStack_f0 = 0;
            uStack_ec = 0;
            local_e8 = 0;
            local_e0 = 0;
            local_d0 = (undefined1  [16])0x0;
            local_c0 = 0;
            if (iVar38 != 0) break;
            lVar58 = lVar58 + 1;
            lVar41 = (long)(this->super_DeconvolutionDepthWise).group;
            iVar54 = iVar54 + local_248;
            iVar55 = iVar55 + local_238;
            bVar20 = lVar58 < lVar41;
          } while (lVar58 < lVar41);
        }
        if (bVar20) {
          bVar20 = false;
        }
        else {
          if (local_2d8 < uVar33) {
            convert_packing((Mat *)local_208,&local_298,uVar33,opt);
            if (local_298.data == (void *)0x0) goto LAB_00470530;
            if ((long)local_298.c * local_298.cstep == 0) {
              bVar20 = false;
              iVar47 = -100;
              goto LAB_004706f1;
            }
          }
          else {
            piVar15 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + 1;
              UNLOCK();
            }
            piVar15 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
            if (piVar15 != (int *)0x0) {
              LOCK();
              *piVar15 = *piVar15 + -1;
              UNLOCK();
              if (*piVar15 == 0) {
                if (local_298.allocator == (Allocator *)0x0) {
                  if (local_298.data != (void *)0x0) {
                    free(local_298.data);
                  }
                }
                else {
                  (*(local_298.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            auVar93 = auStack_1e0;
            local_298.data = (void *)local_208._0_8_;
            local_298.refcount._0_4_ = local_208._8_4_;
            local_298.refcount._4_4_ = local_208._12_4_;
            local_298.elemsize._0_4_ = (undefined4)local_208._16_8_;
            local_298.elemsize._4_4_ = SUB84(local_208._16_8_,4);
            local_298.elempack = local_208._24_4_;
            local_298.allocator = (Allocator *)local_208._32_8_;
            local_298.dims = auStack_1e0._0_4_;
            local_298.w = auStack_1e0._4_4_;
            local_298.h = auStack_1e0._8_4_;
            local_298.d = auStack_1e0._12_4_;
            local_298.c = (int)uStack_1d0;
            local_298.cstep = local_1c8;
            auStack_1e0 = auVar93;
          }
          bVar20 = true;
        }
      }
LAB_004706f1:
      piVar15 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
            if ((void *)local_208._0_8_ != (void *)0x0) {
              free((void *)local_208._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_208._32_8_)[3])();
          }
        }
      }
      local_1c8 = 0;
      local_208._0_8_ = (void *)0x0;
      local_208._8_4_ = 0;
      local_208._12_4_ = 0;
      local_208._16_8_ = (Allocator *)0x0;
      local_208._24_4_ = 0;
      auStack_1e0 = (undefined1  [16])0x0;
      uStack_1d0 = uStack_1d0 & 0xffffffff00000000;
    }
    piVar15 = (int *)CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if ((Allocator *)local_1b8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_1b8._0_8_ != (void *)0x0) {
            free((void *)local_1b8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_1b8._32_8_)[3])();
        }
      }
    }
    local_178 = 0;
    local_1b8._0_8_ = (void *)0x0;
    local_1b8._8_4_ = 0;
    local_1b8._12_4_ = 0;
    local_1b8._16_8_ = 0;
    local_1b8._24_4_ = 0;
    local_190 = (undefined1  [16])0x0;
    local_180 = 0;
    if (!bVar20) goto LAB_00470818;
  }
  pMVar32 = local_1c0;
  DeconvolutionDepthWise::cut_padding(&this->super_DeconvolutionDepthWise,&local_298,local_1c0,opt);
  iVar47 = -100;
  if ((pMVar32->data != (void *)0x0) && (iVar47 = -100, (long)local_1c0->c * local_1c0->cstep != 0))
  {
    iVar47 = 0;
  }
LAB_00470818:
  piVar15 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        if (local_298.data != (void *)0x0) {
          free(local_298.data);
        }
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar47;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}